

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O3

void Io_NtkWritePis(FILE *pFile,Abc_Ntk_t *pNtk,int fWriteLatches)

{
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  size_t sVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  if (fWriteLatches == 0) {
    pVVar4 = pNtk->vCis;
    if (0 < pVVar4->nSize) {
      iVar8 = 7;
      lVar6 = 0;
      iVar5 = 0;
      do {
        pAVar1 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*pVVar4->pArray[lVar6] + 0x20) + 8) +
                  (long)**(int **)((long)pVVar4->pArray[lVar6] + 0x30) * 8);
        pcVar2 = Abc_ObjName(pAVar1);
        sVar3 = strlen(pcVar2);
        iVar7 = (int)sVar3 + 1;
        if (iVar5 == 0) {
LAB_0032037e:
          iVar5 = 0;
        }
        else if (0x4b < iVar8 + iVar7) {
          fwrite(" \\\n",3,1,(FILE *)pFile);
          iVar8 = 0;
          goto LAB_0032037e;
        }
        pcVar2 = Abc_ObjName(pAVar1);
        fprintf((FILE *)pFile," %s",pcVar2);
        iVar8 = iVar8 + iVar7;
        iVar5 = iVar5 + 1;
        lVar6 = lVar6 + 1;
        pVVar4 = pNtk->vCis;
      } while (lVar6 < pVVar4->nSize);
    }
  }
  else {
    pVVar4 = pNtk->vPis;
    if (0 < pVVar4->nSize) {
      iVar8 = 7;
      lVar6 = 0;
      iVar5 = 0;
      do {
        pAVar1 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*pVVar4->pArray[lVar6] + 0x20) + 8) +
                  (long)**(int **)((long)pVVar4->pArray[lVar6] + 0x30) * 8);
        pcVar2 = Abc_ObjName(pAVar1);
        sVar3 = strlen(pcVar2);
        iVar7 = (int)sVar3 + 1;
        if (iVar5 == 0) {
LAB_003202c8:
          iVar5 = 0;
        }
        else if (0x4b < iVar8 + iVar7) {
          fwrite(" \\\n",3,1,(FILE *)pFile);
          iVar8 = 0;
          goto LAB_003202c8;
        }
        pcVar2 = Abc_ObjName(pAVar1);
        fprintf((FILE *)pFile," %s",pcVar2);
        iVar8 = iVar8 + iVar7;
        iVar5 = iVar5 + 1;
        lVar6 = lVar6 + 1;
        pVVar4 = pNtk->vPis;
      } while (lVar6 < pVVar4->nSize);
    }
  }
  return;
}

Assistant:

void Io_NtkWritePis( FILE * pFile, Abc_Ntk_t * pNtk, int fWriteLatches )
{
    Abc_Obj_t * pTerm, * pNet;
    int LineLength;
    int AddedLength;
    int NameCounter;
    int i;

    LineLength  = 7;
    NameCounter = 0;

    if ( fWriteLatches )
    {
        Abc_NtkForEachPi( pNtk, pTerm, i )
        {
            pNet = Abc_ObjFanout0(pTerm);
            // get the line length after this name is written
            AddedLength = strlen(Abc_ObjName(pNet)) + 1;
            if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
            { // write the line extender
                fprintf( pFile, " \\\n" );
                // reset the line length
                LineLength  = 0;
                NameCounter = 0;
            }
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
            LineLength += AddedLength;
            NameCounter++;
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pTerm, i )
        {
            pNet = Abc_ObjFanout0(pTerm);
            // get the line length after this name is written
            AddedLength = strlen(Abc_ObjName(pNet)) + 1;
            if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
            { // write the line extender
                fprintf( pFile, " \\\n" );
                // reset the line length
                LineLength  = 0;
                NameCounter = 0;
            }
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
            LineLength += AddedLength;
            NameCounter++;
        }
    }
}